

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawSpanMaskedAddClampPalCommand::Execute
          (DrawSpanMaskedAddClampPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  dsfixed_t dVar2;
  dsfixed_t dVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  bool bVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  dsfixed_t dVar19;
  dsfixed_t dVar20;
  int iVar21;
  
  bVar13 = DrawerThread::line_skipped_by_thread(thread,(this->super_PalSpanCommand)._y);
  if (!bVar13) {
    puVar5 = (this->super_PalSpanCommand)._source;
    puVar6 = (this->super_PalSpanCommand)._colormap;
    puVar7 = (this->super_PalSpanCommand)._srcblend;
    puVar8 = (this->super_PalSpanCommand)._destblend;
    dVar19 = (this->super_PalSpanCommand)._xfrac;
    dVar20 = (this->super_PalSpanCommand)._yfrac;
    iVar1 = (this->super_PalSpanCommand)._x1;
    iVar14 = (&ylookup)[(this->super_PalSpanCommand)._y] + iVar1;
    iVar21 = ((this->super_PalSpanCommand)._x2 - iVar1) + 1;
    dVar2 = (this->super_PalSpanCommand)._xstep;
    dVar3 = (this->super_PalSpanCommand)._ystep;
    iVar1 = (this->super_PalSpanCommand)._xbits;
    iVar4 = (this->super_PalSpanCommand)._ybits;
    puVar9 = (this->super_PalSpanCommand)._destorg;
    if (iVar4 == 6 && iVar1 == 6) {
      lVar15 = 0;
      do {
        uVar16 = (ulong)puVar5[dVar20 >> 0x1a | dVar19 >> 0x14 & 0xffffffc0];
        if (uVar16 != 0) {
          uVar17 = puVar8[puVar9[lVar15 + iVar14]] + puVar7[puVar6[uVar16]];
          uVar18 = uVar17 & 0x40100400;
          uVar17 = uVar18 - (uVar18 >> 5) | uVar17 & 0x3e0f83e0 | 0x1f07c1f;
          puVar9[lVar15 + iVar14] = RGB32k.All[uVar17 >> 0xf & uVar17];
        }
        dVar19 = dVar19 + dVar2;
        dVar20 = dVar20 + dVar3;
        lVar15 = lVar15 + 1;
      } while (iVar21 != (int)lVar15);
    }
    else {
      bVar12 = (byte)iVar4;
      bVar11 = 0x20 - bVar12;
      bVar10 = (byte)iVar1;
      lVar15 = 0;
      do {
        uVar16 = (ulong)puVar5[(int)((dVar20 >> (bVar11 & 0x1f)) +
                                    (dVar19 >> (bVar11 - bVar10 & 0x1f) &
                                    ~(-1 << (bVar10 & 0x1f)) << (bVar12 & 0x1f)))];
        if (uVar16 != 0) {
          uVar18 = puVar8[puVar9[lVar15 + iVar14]] + puVar7[puVar6[uVar16]];
          uVar17 = uVar18 & 0x40100400;
          uVar17 = uVar17 - (uVar17 >> 5) | uVar18 & 0x3e0f83e0 | 0x1f07c1f;
          puVar9[lVar15 + iVar14] = RGB32k.All[uVar17 >> 0xf & uVar17];
        }
        dVar19 = dVar19 + dVar2;
        dVar20 = dVar20 + dVar3;
        lVar15 = lVar15 + 1;
      } while (iVar21 != (int)lVar15);
    }
  }
  return;
}

Assistant:

void DrawSpanMaskedAddClampPalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(_y))
			return;

		dsfixed_t xfrac;
		dsfixed_t yfrac;
		dsfixed_t xstep;
		dsfixed_t ystep;
		uint8_t *dest;
		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		int count;
		int spot;
		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		xfrac = _xfrac;
		yfrac = _yfrac;

		dest = ylookup[_y] + _x1 + _destorg;

		count = _x2 - _x1 + 1;

		xstep = _xstep;
		ystep = _ystep;

		if (_xbits == 6 && _ybits == 6)
		{
			// 64x64 is the most common case by far, so special case it.
			do
			{
				uint8_t texdata;

				spot = ((xfrac >> (32 - 6 - 6))&(63 * 64)) + (yfrac >> (32 - 6));
				texdata = source[spot];
				if (texdata != 0)
				{
					uint32_t a = fg2rgb[colormap[texdata]] + bg2rgb[*dest];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					*dest = RGB32k.All[a & (a >> 15)];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
		else
		{
			uint8_t yshift = 32 - _ybits;
			uint8_t xshift = yshift - _xbits;
			int xmask = ((1 << _xbits) - 1) << _ybits;
			do
			{
				uint8_t texdata;

				spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
				texdata = source[spot];
				if (texdata != 0)
				{
					uint32_t a = fg2rgb[colormap[texdata]] + bg2rgb[*dest];
					uint32_t b = a;

					a |= 0x01f07c1f;
					b &= 0x40100400;
					a &= 0x3fffffff;
					b = b - (b >> 5);
					a |= b;
					*dest = RGB32k.All[a & (a >> 15)];
				}
				dest++;
				xfrac += xstep;
				yfrac += ystep;
			} while (--count);
		}
	}